

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall
MipsParser::parseRegisterNumber
          (MipsParser *this,Parser *parser,MipsRegisterValue *dest,int numValues)

{
  Token *pTVar1;
  int64_t iVar2;
  int64_t local_80;
  string local_78;
  Identifier local_58;
  Token *local_38;
  Token *number;
  MipsRegisterValue *pMStack_28;
  int numValues_local;
  MipsRegisterValue *dest_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  number._4_4_ = numValues;
  pMStack_28 = dest;
  dest_local = (MipsRegisterValue *)parser;
  parser_local = (Parser *)this;
  pTVar1 = Parser::peekToken(parser,0);
  if (((pTVar1->type == Dollar) &&
      (local_38 = Parser::peekToken((Parser *)dest_local,1), local_38->type == Integer)) &&
     (iVar2 = Token::intValue(local_38), iVar2 < number._4_4_)) {
    local_80 = Token::intValue(local_38);
    tinyformat::format<long>(&local_78,"$%d",&local_80);
    Identifier::Identifier(&local_58,&local_78);
    Identifier::operator=(&pMStack_28->name,&local_58);
    Identifier::~Identifier(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    iVar2 = Token::intValue(local_38);
    pMStack_28->num = (int)iVar2;
    Parser::eatTokens((Parser *)dest_local,2);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MipsParser::parseRegisterNumber(Parser& parser, MipsRegisterValue& dest, int numValues)
{
	// check for $0 and $1
	if (parser.peekToken().type == TokenType::Dollar)
	{
		const Token& number = parser.peekToken(1);
		if (number.type == TokenType::Integer && number.intValue() < numValues)
		{
			dest.name = Identifier(tfm::format("$%d", number.intValue()));
			dest.num = (int) number.intValue();

			parser.eatTokens(2);
			return true;
		}
	}

	return false;
}